

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *__lhs;
  char cVar1;
  char cVar2;
  cmExecutionStatus *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  Status SVar7;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string sdestdir;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  
  __lhs = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (bVar5 = std::operator!=(__lhs,"/"), bVar5)) {
    pcVar3 = (this->super_cmFileCopier).Status;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sdestdir,
               "called with inappropriate arguments. No DESTINATION provided or .",
               (allocator<char> *)&message);
    std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
    std::__cxx11::string::~string((string *)&sdestdir);
    return false;
  }
  sdestdir._M_dataplus._M_p = (pointer)&sdestdir.field_2;
  sdestdir._M_string_length = 0;
  sdestdir.field_2._M_local_buf[0] = '\0';
  bVar5 = cmsys::SystemTools::GetEnv("DESTDIR",&sdestdir);
  if (bVar5 && sdestdir._M_string_length != 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(&sdestdir);
    pcVar4 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
    cVar1 = *pcVar4;
    bVar5 = true;
    if (2 < (this->super_cmFileCopier).Destination._M_string_length) {
      bVar5 = pcVar4[2] != '/';
    }
    cVar2 = pcVar4[1];
    if (cVar1 != '/') {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if ((bool)(cVar2 != ':' | bVar5)) {
LAB_003bec95:
          pcVar3 = (this->super_cmFileCopier).Status;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,
                     "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                     ,(allocator<char> *)&local_70);
          std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
          goto LAB_003bedfc;
        }
      }
      else if ((bool)(cVar2 != ':' | bVar5 | (byte)(cVar1 + 0xa5U) < 0xe6)) goto LAB_003bec95;
LAB_003becc5:
      std::__cxx11::string::substr((ulong)&local_70,(ulong)__lhs);
      std::operator+(&message,&sdestdir,&local_70);
      std::__cxx11::string::operator=((string *)__lhs,(string *)&message);
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&local_70);
      this->DestDirLength = (int)sdestdir._M_string_length;
      goto LAB_003bed15;
    }
    if (cVar2 != '/') goto LAB_003becc5;
    cmStrCat<char_const(&)[165],std::__cxx11::string&>
              (&message,(char (*) [165])
                        "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
               ,__lhs);
    std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
LAB_003bedfc:
    std::__cxx11::string::~string((string *)&message);
  }
  else {
LAB_003bed15:
    default_dir_mode = &default_dir_mode_v;
    default_dir_mode_v = 0;
    bVar5 = cmFileCopier::GetDefaultDirectoryPermissions
                      (&this->super_cmFileCopier,&default_dir_mode);
    if (bVar5) {
      bVar5 = true;
      if (*(int *)&(this->super_cmFileCopier).field_0xf4 == 6) goto LAB_003bee08;
      bVar6 = cmsys::SystemTools::FileExists(__lhs);
      if ((bVar6) ||
         (SVar7 = cmsys::SystemTools::MakeDirectory(__lhs,default_dir_mode), SVar7.Kind_ == Success)
         ) {
        bVar6 = cmsys::SystemTools::FileIsDirectory(__lhs);
        if (bVar6) goto LAB_003bee08;
        std::operator+(&local_70,"INSTALL destination: ",__lhs);
        std::operator+(&message,&local_70," is not a directory.");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      }
      else {
        std::operator+(&local_70,"cannot create directory: ",__lhs);
        std::operator+(&message,&local_70,". Maybe need administrative privileges.");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      }
      goto LAB_003bedfc;
    }
  }
  bVar5 = false;
LAB_003bee08:
  std::__cxx11::string::~string((string *)&sdestdir);
  return bVar5;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if (destination.size() < 2 && destination != "/") {
    this->Status.SetError("called with inappropriate arguments. "
                          "No DESTINATION provided or .");
    return false;
  }

  std::string sdestdir;
  if (cmSystemTools::GetEnv("DESTDIR", sdestdir) && !sdestdir.empty()) {
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if (destination.size() > 2) {
      ch3 = destination[2];
    }
    int skip = 0;
    if (ch1 != '/') {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
          ch2 == ':') {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if (ch3 != '/') {
          relative = 1;
        }
      } else {
        relative = 1;
      }
      if (relative) {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->Status.SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
      }
    } else {
      if (ch2 == '/') {
        // looks like a network path.
        std::string message =
          cmStrCat("called with network path DESTINATION. This "
                   "does not make sense when using DESTDIR. Specify local "
                   "absolute path or remove DESTDIR environment variable."
                   "\nDESTINATION=\n",
                   destination);
        this->Status.SetError(message);
        return false;
      }
    }
    destination = sdestdir + destination.substr(skip);
    this->DestDirLength = static_cast<int>(sdestdir.size());
  }

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  if (this->InstallType != cmInstallType_DIRECTORY) {
    if (!cmSystemTools::FileExists(destination)) {
      if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->Status.SetError(errstring);
        return false;
      }
    }
    if (!cmSystemTools::FileIsDirectory(destination)) {
      std::string errstring =
        "INSTALL destination: " + destination + " is not a directory.";
      this->Status.SetError(errstring);
      return false;
    }
  }
  return true;
}